

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall
ON_RevSurface::SetAngleRadians
          (ON_RevSurface *this,double start_angle_radians,double end_angle_radians)

{
  double dVar1;
  double d;
  double dStack_20;
  bool rc;
  double end_angle_radians_local;
  double start_angle_radians_local;
  ON_RevSurface *this_local;
  
  d._7_1_ = false;
  dVar1 = end_angle_radians - start_angle_radians;
  if (0.0 <= dVar1) {
    if ((dVar1 <= 2.3283064365386963e-10) ||
       (dStack_20 = end_angle_radians, 6.283185307179586 < dVar1)) {
      dStack_20 = start_angle_radians + 6.283185307179586;
    }
    ON_Interval::Set(&this->m_angle,start_angle_radians,dStack_20);
    d._7_1_ = true;
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  }
  return d._7_1_;
}

Assistant:

bool ON_RevSurface::SetAngleRadians(
  double start_angle_radians,
  double end_angle_radians
  )
{
  bool rc = false;
  double d = end_angle_radians-start_angle_radians;
  if ( d >= 0.0 )
  {
    if ( d <= ON_ZERO_TOLERANCE || d > 2.0*ON_PI )
    {
      end_angle_radians = start_angle_radians + 2.0*ON_PI;
    }
    m_angle.Set( start_angle_radians, end_angle_radians );
    rc = true;
    DestroySurfaceTree();
  }
  return rc;
}